

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notifier.hpp
# Opt level: O0

void __thiscall tf::Notifier::notify(Notifier *this,bool all)

{
  ulong uVar1;
  __pointer_type pWVar2;
  __int_type_conflict1 _Var3;
  reference pvVar4;
  Waiter *w_1;
  uint64_t next;
  Waiter *wnext;
  Waiter *w;
  uint64_t newstate;
  uint64_t waiters;
  uint64_t state;
  Notifier *pNStack_78;
  bool all_local;
  Notifier *this_local;
  memory_order local_68;
  int local_64;
  memory_order __b;
  undefined4 local_58;
  undefined4 local_54;
  Waiter *local_50;
  uint64_t *local_48;
  Notifier *local_40;
  bool local_31;
  Waiter *local_30;
  memory_order local_28;
  undefined4 local_24;
  Waiter *local_20;
  uint64_t *local_18;
  Notifier *local_10;
  
  local_58 = 5;
  local_64 = 2;
  state._7_1_ = all;
  pNStack_78 = this;
  ___b = this;
  local_68 = std::operator&(acquire,__memory_order_mask);
  if (local_64 - 1U < 2) {
    this_local = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
  }
  else if (local_64 == 5) {
    this_local = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
  }
  else {
    this_local = (Notifier *)(this->_state).super___atomic_base<unsigned_long>._M_i;
  }
  waiters = (uint64_t)this_local;
  do {
    if (((waiters & 0xffff) == 0xffff) && ((waiters & 0xffff0000) == 0)) {
      return;
    }
    uVar1 = (waiters & 0xffff0000) >> 0x10;
    if ((state._7_1_ & 1) == 0) {
      if (uVar1 == 0) {
        pvVar4 = std::vector<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>::
                 operator[](&this->_waiters,waiters & 0xffff);
        pWVar2 = std::atomic<tf::Notifier::Waiter_*>::load(&pvVar4->next,relaxed);
        w_1 = (Waiter *)0xffff;
        if (pWVar2 != (__pointer_type)0x0) {
          pvVar4 = std::vector<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>::
                   operator[](&this->_waiters,0);
          w_1 = (Waiter *)(((long)pWVar2 - (long)pvVar4) / 0x70);
        }
        w = (Waiter *)((long)&(w_1->next)._M_b._M_p + (waiters & 0xffffffff00000000));
      }
      else {
        w = (Waiter *)(waiters + 0xffff0000);
      }
    }
    else {
      w = (Waiter *)((waiters & 0xffffffff00000000) + (uVar1 << 0x20) + 0xffff);
    }
    local_50 = w;
    local_54 = 2;
    local_48 = &waiters;
    local_40 = this;
    local_28 = std::__cmpexch_failure_order(acquire);
    local_20 = w;
    local_24 = 2;
    local_30 = w;
    switch(0x156393) {
    default:
      if (local_28 - consume < 2) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else if (local_28 == seq_cst) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      break;
    case 2:
      if (local_28 - consume < 2) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else if (local_28 == seq_cst) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      break;
    case 3:
      if (local_28 - consume < 2) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else if (local_28 == seq_cst) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      break;
    case 4:
      if (local_28 - consume < 2) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else if (local_28 == seq_cst) {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
      else {
        LOCK();
        _Var3 = (this->_state).super___atomic_base<unsigned_long>._M_i;
        local_31 = waiters == _Var3;
        if (local_31) {
          (this->_state).super___atomic_base<unsigned_long>._M_i = (__int_type_conflict1)w;
          _Var3 = waiters;
        }
        UNLOCK();
        if (!local_31) {
          waiters = _Var3;
        }
      }
    }
    local_18 = &waiters;
    local_10 = this;
  } while (local_31 == false);
  if ((((state._7_1_ & 1) != 0) || (uVar1 == 0)) && ((waiters & 0xffff) != 0xffff)) {
    pvVar4 = std::vector<tf::Notifier::Waiter,_std::allocator<tf::Notifier::Waiter>_>::operator[]
                       (&this->_waiters,waiters & 0xffff);
    if ((state._7_1_ & 1) == 0) {
      std::atomic<tf::Notifier::Waiter_*>::store(&pvVar4->next,(__pointer_type)0x0,relaxed);
    }
    _unpark(this,pvVar4);
  }
  return;
}

Assistant:

void notify(bool all) {
    std::atomic_thread_fence(std::memory_order_seq_cst);
    uint64_t state = _state.load(std::memory_order_acquire);
    for (;;) {
      // Easy case: no waiters.
      if ((state & kStackMask) == kStackMask && (state & kWaiterMask) == 0)
        return;
      uint64_t waiters = (state & kWaiterMask) >> kWaiterShift;
      uint64_t newstate;
      if (all) {
        // Reset prewait counter and empty wait list.
        newstate = (state & kEpochMask) + (kEpochInc * waiters) + kStackMask;
      } else if (waiters) {
        // There is a thread in pre-wait state, unblock it.
        newstate = state + kEpochInc - kWaiterInc;
      } else {
        // Pop a waiter from list and unpark it.
        Waiter* w = &_waiters[state & kStackMask];
        Waiter* wnext = w->next.load(std::memory_order_relaxed);
        uint64_t next = kStackMask;
        //if (wnext != nullptr) next = wnext - &_waiters[0];
        if (wnext != nullptr) next = static_cast<uint64_t>(wnext - &_waiters[0]);
        // Note: we don't add kEpochInc here. ABA problem on the lock-free stack
        // can't happen because a waiter is re-pushed onto the stack only after
        // it was in the pre-wait state which inevitably leads to epoch
        // increment.
        newstate = (state & kEpochMask) + next;
      }
      if (_state.compare_exchange_weak(state, newstate,
                                       std::memory_order_acquire)) {
        if (!all && waiters) return;  // unblocked pre-wait thread
        if ((state & kStackMask) == kStackMask) return;
        Waiter* w = &_waiters[state & kStackMask];
        if (!all) w->next.store(nullptr, std::memory_order_relaxed);
        _unpark(w);
        return;
      }
    }
  }